

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

bool __thiscall
CoreML::Specification::Optimizer::MergePartialFromCodedStream
          (Optimizer *this,CodedInputStream *input)

{
  byte bVar1;
  byte *pbVar2;
  bool bVar3;
  uint32 uVar4;
  uint uVar5;
  int iVar6;
  SGDOptimizer *this_00;
  ulong extraout_RAX;
  AdamOptimizer *this_01;
  ulong extraout_RAX_00;
  ulong uVar7;
  int local_38;
  int local_34;
  
  do {
    pbVar2 = input->buffer_;
    uVar4 = 0;
    if (pbVar2 < input->buffer_end_) {
      bVar1 = *pbVar2;
      uVar4 = (uint32)bVar1;
      if ((char)bVar1 < '\x01') goto LAB_004c1740;
      input->buffer_ = pbVar2 + 1;
      uVar7 = (ulong)bVar1 | 0x100000000;
    }
    else {
LAB_004c1740:
      uVar4 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar4);
      uVar7 = 0;
      if (uVar4 - 1 < 0x7f) {
        uVar7 = 0x100000000;
      }
      uVar7 = uVar4 | uVar7;
    }
    uVar4 = (uint32)uVar7;
    if ((uVar7 & 0x100000000) == 0) {
LAB_004c17df:
      iVar6 = 7;
      if ((uVar4 & 7) != 4 && uVar4 != 0) {
        bVar3 = google::protobuf::internal::WireFormatLite::SkipField(input,uVar4);
        if (bVar3) goto LAB_004c1804;
        iVar6 = 6;
      }
    }
    else {
      uVar5 = (uint)(uVar7 >> 3) & 0x1fffffff;
      if (uVar5 == 0xb) {
        if ((char)uVar7 != 'Z') goto LAB_004c17df;
        if (this->_oneof_case_[0] != 0xb) {
          clear_OptimizerType(this);
          this->_oneof_case_[0] = 0xb;
          this_01 = (AdamOptimizer *)operator_new(0x40);
          AdamOptimizer::AdamOptimizer(this_01);
          (this->OptimizerType_).adamoptimizer_ = this_01;
        }
        MergePartialFromCodedStream();
        iVar6 = local_38;
        if ((extraout_RAX_00 & 1) == 0) goto LAB_004c1804;
      }
      else {
        if ((uVar5 != 10) || ((char)uVar7 != 'R')) goto LAB_004c17df;
        if (this->_oneof_case_[0] != 10) {
          clear_OptimizerType(this);
          this->_oneof_case_[0] = 10;
          this_00 = (SGDOptimizer *)operator_new(0x30);
          SGDOptimizer::SGDOptimizer(this_00);
          (this->OptimizerType_).sgdoptimizer_ = this_00;
        }
        MergePartialFromCodedStream();
        iVar6 = local_34;
        if ((extraout_RAX & 1) != 0) goto LAB_004c1806;
LAB_004c1804:
        iVar6 = 0;
      }
    }
LAB_004c1806:
    if (iVar6 != 0) {
      return iVar6 != 6;
    }
  } while( true );
}

Assistant:

bool Optimizer::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:CoreML.Specification.Optimizer)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(127u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // .CoreML.Specification.SGDOptimizer sgdOptimizer = 10;
      case 10: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(82u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_sgdoptimizer()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.AdamOptimizer adamOptimizer = 11;
      case 11: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(90u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_adamoptimizer()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:CoreML.Specification.Optimizer)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:CoreML.Specification.Optimizer)
  return false;
#undef DO_
}